

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddCount.c
# Opt level: O0

double cuddZddCountDoubleStep(DdNode *P,st__table *table,DdNode *base,DdNode *empty)

{
  int iVar1;
  double dVar2;
  double dVar3;
  char *local_40;
  double *dummy;
  double res;
  DdNode *empty_local;
  DdNode *base_local;
  st__table *table_local;
  DdNode *P_local;
  
  if (P == empty) {
    P_local = (DdNode *)0x0;
  }
  else if (P == base) {
    P_local = (DdNode *)0x3ff0000000000000;
  }
  else {
    res = (double)empty;
    empty_local = base;
    base_local = (DdNode *)table;
    table_local = (st__table *)P;
    iVar1 = st__lookup(table,(char *)P,&local_40);
    if (iVar1 == 0) {
      dVar2 = cuddZddCountDoubleStep
                        (*(DdNode **)&table_local->max_density,(st__table *)base_local,empty_local,
                         (DdNode *)res);
      dVar3 = cuddZddCountDoubleStep
                        (*(DdNode **)&table_local->num_bins,(st__table *)base_local,empty_local,
                         (DdNode *)res);
      dummy = (double *)(dVar2 + dVar3);
      local_40 = (char *)malloc(8);
      if (local_40 == (char *)0x0) {
        P_local = (DdNode *)0xbff0000000000000;
      }
      else {
        *(double **)local_40 = dummy;
        iVar1 = st__insert((st__table *)base_local,(char *)table_local,local_40);
        if (iVar1 == -10000) {
          if (local_40 != (char *)0x0) {
            free(local_40);
          }
          P_local = (DdNode *)0xbff0000000000000;
        }
        else {
          P_local = (DdNode *)dummy;
        }
      }
    }
    else {
      P_local = *(DdNode **)local_40;
    }
  }
  return (double)P_local;
}

Assistant:

static double
cuddZddCountDoubleStep(
  DdNode * P,
  st__table * table,
  DdNode * base,
  DdNode * empty)
{
    double      res;
    double      *dummy;

    if (P == empty)
        return((double)0.0);
    if (P == base)
        return((double)1.0);

    /* Check cache */
    if ( st__lookup(table, (const char *)P, (char **)&dummy)) {
        res = *dummy;
        return(res);
    }

    res = cuddZddCountDoubleStep(cuddE(P), table, base, empty) +
        cuddZddCountDoubleStep(cuddT(P), table, base, empty);

    dummy = ABC_ALLOC(double, 1);
    if (dummy == NULL) {
        return((double)CUDD_OUT_OF_MEM);
    }
    *dummy = res;
    if ( st__insert(table, (char *)P, (char *)dummy) == st__OUT_OF_MEM) {
        ABC_FREE(dummy);
        return((double)CUDD_OUT_OF_MEM);
    }

    return(res);

}